

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O2

QPushButton * __thiscall
QDialogButtonBoxPrivate::createButton
          (QDialogButtonBoxPrivate *this,StandardButton sbutton,LayoutRule layoutRule)

{
  long lVar1;
  QWidget *parent;
  bool bVar2;
  char cVar3;
  int iVar4;
  ButtonRole role;
  QWidget *this_00;
  QStyle *style;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  QPushButton *pQStack_80;
  QPushButton *button;
  StandardButton sbutton_local;
  QKeySequence standardShortcut;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQStack_80 = (QPushButton *)0x0;
  sbutton_local = sbutton;
  if (sbutton == NoButton) goto LAB_004349bf;
  parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if (sbutton == LastButton) {
    pQStack_80 = (QPushButton *)0x4d;
LAB_00434868:
    bVar2 = true;
  }
  else {
    if (sbutton == Save) {
      pQStack_80 = (QPushButton *)0x2b;
      goto LAB_00434868;
    }
    if (sbutton == SaveAll) {
      pQStack_80 = (QPushButton *)0x49;
      goto LAB_00434868;
    }
    if (sbutton == Open) {
      pQStack_80 = (QPushButton *)0x2a;
      goto LAB_00434868;
    }
    if (sbutton == Yes) {
      pQStack_80 = (QPushButton *)0x30;
      goto LAB_00434868;
    }
    if (sbutton == YesToAll) {
      pQStack_80 = (QPushButton *)0x47;
      goto LAB_00434868;
    }
    if (sbutton == No) {
      pQStack_80 = (QPushButton *)0x31;
      goto LAB_00434868;
    }
    if (sbutton == NoToAll) {
      pQStack_80 = (QPushButton *)0x48;
      goto LAB_00434868;
    }
    if (sbutton == Abort) {
      pQStack_80 = (QPushButton *)0x4a;
      goto LAB_00434868;
    }
    if (sbutton == Retry) {
      pQStack_80 = (QPushButton *)0x4b;
      goto LAB_00434868;
    }
    if (sbutton == Ignore) {
      pQStack_80 = (QPushButton *)0x4c;
      goto LAB_00434868;
    }
    if (sbutton == Close) {
      pQStack_80 = (QPushButton *)0x2c;
      goto LAB_00434868;
    }
    if (sbutton == Cancel) {
      pQStack_80 = (QPushButton *)0x28;
      goto LAB_00434868;
    }
    if (sbutton == Discard) {
      pQStack_80 = (QPushButton *)0x2f;
      goto LAB_00434868;
    }
    if (sbutton == Help) {
      pQStack_80 = (QPushButton *)0x29;
      goto LAB_00434868;
    }
    if (sbutton == Apply) {
      pQStack_80 = (QPushButton *)0x2d;
      goto LAB_00434868;
    }
    if (sbutton == Reset) {
      pQStack_80 = (QPushButton *)0x2e;
      goto LAB_00434868;
    }
    bVar2 = false;
    if (sbutton == FirstButton) {
      pQStack_80 = (QPushButton *)0x27;
      goto LAB_00434868;
    }
  }
  this_00 = (QWidget *)operator_new(0x28);
  (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x88))
            ((QArrayDataPointer<char16_t> *)&standardShortcut,QGuiApplicationPrivate::platform_theme
             ,sbutton);
  QPushButton::QPushButton((QPushButton *)this_00,(QString *)&standardShortcut,parent);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&standardShortcut);
  button = (QPushButton *)this_00;
  style = QWidget::style(parent);
  iVar4 = (**(code **)(*(long *)style + 0xf0))(style,0x47,0,parent);
  if ((bVar2) && (iVar4 != 0)) {
    (**(code **)(*(long *)style + 0x100))(&standardShortcut,style,pQStack_80,0);
    QAbstractButton::setIcon((QAbstractButton *)this_00,(QIcon *)&standardShortcut);
    QIcon::~QIcon((QIcon *)&standardShortcut);
  }
  pQVar5 = QApplication::style();
  if (style != pQVar5) {
    QWidget::setStyle(this_00,style);
  }
  QFlatMap<QPushButton*,QDialogButtonBox::StandardButton,std::less<QPushButton*>,QVarLengthArray<QPushButton*,8ll>,QVarLengthArray<QDialogButtonBox::StandardButton,8ll>>
  ::try_emplace<QDialogButtonBox::StandardButton_const&>
            ((pair<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>::iterator,_bool>
              *)&standardShortcut,&this->standardButtonMap,&button,&sbutton_local);
  role = QPlatformDialogHelper::buttonRole(sbutton_local);
  if (role == InvalidRole) {
    _standardShortcut = 2;
    QMessageLogger::warning
              ((char *)&standardShortcut,
               "QDialogButtonBox::createButton: Invalid ButtonRole, button not added");
  }
  else {
    addButton(this,&button->super_QAbstractButton,role,layoutRule,Connect);
  }
  _standardShortcut = 0xaaaaaaaa;
  (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x90))
            (&standardShortcut,QGuiApplicationPrivate::platform_theme,sbutton_local);
  cVar3 = QKeySequence::isEmpty();
  if (cVar3 == '\0') {
    QAbstractButton::setShortcut(&button->super_QAbstractButton,&standardShortcut);
  }
  pQStack_80 = button;
  QKeySequence::~QKeySequence(&standardShortcut);
LAB_004349bf:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQStack_80;
  }
  __stack_chk_fail();
}

Assistant:

QPushButton *QDialogButtonBoxPrivate::createButton(QDialogButtonBox::StandardButton sbutton,
                                                   LayoutRule layoutRule)
{
    Q_Q(QDialogButtonBox);
    int icon = 0;

    switch (sbutton) {
    case QDialogButtonBox::Ok:
        icon = QStyle::SP_DialogOkButton;
        break;
    case QDialogButtonBox::Save:
        icon = QStyle::SP_DialogSaveButton;
        break;
    case QDialogButtonBox::Open:
        icon = QStyle::SP_DialogOpenButton;
        break;
    case QDialogButtonBox::Cancel:
        icon = QStyle::SP_DialogCancelButton;
        break;
    case QDialogButtonBox::Close:
        icon = QStyle::SP_DialogCloseButton;
        break;
    case QDialogButtonBox::Apply:
        icon = QStyle::SP_DialogApplyButton;
        break;
    case QDialogButtonBox::Reset:
        icon = QStyle::SP_DialogResetButton;
        break;
    case QDialogButtonBox::Help:
        icon = QStyle::SP_DialogHelpButton;
        break;
    case QDialogButtonBox::Discard:
        icon = QStyle::SP_DialogDiscardButton;
        break;
    case QDialogButtonBox::Yes:
        icon = QStyle::SP_DialogYesButton;
        break;
    case QDialogButtonBox::No:
        icon = QStyle::SP_DialogNoButton;
        break;
    case QDialogButtonBox::YesToAll:
        icon = QStyle::SP_DialogYesToAllButton;
        break;
    case QDialogButtonBox::NoToAll:
        icon = QStyle::SP_DialogNoToAllButton;
        break;
    case QDialogButtonBox::SaveAll:
        icon = QStyle::SP_DialogSaveAllButton;
        break;
    case QDialogButtonBox::Abort:
        icon = QStyle::SP_DialogAbortButton;
        break;
    case QDialogButtonBox::Retry:
        icon = QStyle::SP_DialogRetryButton;
        break;
    case QDialogButtonBox::Ignore:
        icon = QStyle::SP_DialogIgnoreButton;
        break;
    case QDialogButtonBox::RestoreDefaults:
        icon = QStyle::SP_RestoreDefaultsButton;
        break;
    case QDialogButtonBox::NoButton:
        return nullptr;
        ;
    }
    QPushButton *button = new QPushButton(QGuiApplicationPrivate::platformTheme()->standardButtonText(sbutton), q);
    QStyle *style = q->style();
    if (style->styleHint(QStyle::SH_DialogButtonBox_ButtonsHaveIcons, nullptr, q) && icon != 0)
        button->setIcon(style->standardIcon(QStyle::StandardPixmap(icon), nullptr, q));
    if (style != QApplication::style()) // Propagate style
        button->setStyle(style);
    standardButtonMap.insert(button, sbutton);
    QPlatformDialogHelper::ButtonRole role = QPlatformDialogHelper::buttonRole(static_cast<QPlatformDialogHelper::StandardButton>(sbutton));
    if (Q_UNLIKELY(role == QPlatformDialogHelper::InvalidRole))
        qWarning("QDialogButtonBox::createButton: Invalid ButtonRole, button not added");
    else
        addButton(button, static_cast<QDialogButtonBox::ButtonRole>(role), layoutRule);
#if QT_CONFIG(shortcut)
    const QKeySequence standardShortcut = QGuiApplicationPrivate::platformTheme()->standardButtonShortcut(sbutton);
    if (!standardShortcut.isEmpty())
        button->setShortcut(standardShortcut);
#endif
    return button;
}